

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall
CVmObjByteArray::copy_from_buf(CVmObjByteArray *this,uchar *buf,unsigned_long idx,size_t len)

{
  CVmObjByteArray *in_RCX;
  void *in_RSI;
  size_t copy_len;
  uchar *p;
  size_t avail;
  CVmObjByteArray *local_38;
  size_t *in_stack_ffffffffffffffd0;
  CVmObjByteArray *in_stack_ffffffffffffffd8;
  void *local_10;
  
  local_10 = in_RSI;
  for (; in_RCX != (CVmObjByteArray *)0x0;
      in_RCX = (CVmObjByteArray *)((long)in_RCX - (long)local_38)) {
    in_stack_ffffffffffffffd0 =
         (size_t *)
         get_ele_ptr(in_RCX,(unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    local_38 = in_stack_ffffffffffffffd8;
    if (in_RCX < in_stack_ffffffffffffffd8) {
      local_38 = in_RCX;
    }
    memcpy(in_stack_ffffffffffffffd0,local_10,(size_t)local_38);
    local_10 = (void *)((long)&(local_38->super_CVmObject)._vptr_CVmObject + (long)local_10);
  }
  return;
}

Assistant:

void CVmObjByteArray::copy_from_buf(const unsigned char *buf,
                                    unsigned long idx, size_t len)
{
    /* keep going until we satisfy the request */
    while (len != 0)
    {
        size_t avail;
        unsigned char *p;
        size_t copy_len;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* copy the available bytes or the remaining desired bytes */
        copy_len = avail;
        if (copy_len > len)
            copy_len = len;

        /* copy the bytes */
        memcpy(p, buf, copy_len);

        /* advance past the copied bytes */
        buf += copy_len;
        idx += copy_len;
        len -= copy_len;
    }
}